

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latexOutline.cpp
# Opt level: O2

vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *
getOutlineForLatexFile
          (vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *__return_storage_ptr__,
          File *file)

{
  bool recursive;
  TSNode node;
  Point endPoint;
  TSNode rootNode;
  TSNode local_38;
  
  if ((file->type == Tex) && (file->hasParser != false)) {
    recursive = (g_config->latex).outline.deepSearch;
    (__return_storage_ptr__->super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    File::getRootNode(&local_38,file);
    endPoint = File::getEndPoint(file);
    node.context[2] = local_38.context[2];
    node.context[3] = local_38.context[3];
    node.context[0] = local_38.context[0];
    node.context[1] = local_38.context[1];
    node.id = local_38.id;
    node.tree = local_38.tree;
    generateOutline(__return_storage_ptr__,node,file,recursive,endPoint);
    return __return_storage_ptr__;
  }
  __assert_fail("file.type == File::Type::Tex && file.hasParser",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/handlers/outline/latexOutline.cpp"
                ,0x11d,"vector<DocumentSymbol> getOutlineForLatexFile(File &)");
}

Assistant:

vector<DocumentSymbol> getOutlineForLatexFile (File &file) {
    assert(file.type == File::Type::Tex && file.hasParser);

    bool recursive = g_config->latex.outline.deepSearch;

    vector<DocumentSymbol> outline {};

    TSNode rootNode = file.getRootNode();

    generateOutline(outline, rootNode, file, recursive, file.getEndPoint());

    return outline;
}